

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_utils.cpp
# Opt level: O0

void __thiscall
spvtools::opt::LoopUtils::PopulateLoopNest
          (LoopUtils *this,Loop *new_loop,LoopCloningResult *cloning_result)

{
  LoopDescriptor *this_00;
  bool bVar1;
  mapped_type *ppLVar2;
  TreeDFIterator<spvtools::opt::Loop> *this_01;
  Loop *pLVar3;
  TreeDFIterator<spvtools::opt::Loop> *end;
  unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_> local_2a0;
  Loop *local_298;
  Loop *local_290;
  Loop *local_288;
  Loop *parent;
  Loop *cloned;
  Loop *sub_loop;
  TreeDFIterator<spvtools::opt::Loop> __end2;
  TreeDFIterator<spvtools::opt::Loop> __begin2;
  TreeDFIterator<spvtools::opt::Loop> local_168;
  IteratorRange<spvtools::opt::TreeDFIterator<spvtools::opt::Loop>_> local_110;
  IteratorRange<spvtools::opt::TreeDFIterator<spvtools::opt::Loop>_> *local_60;
  IteratorRange<spvtools::opt::TreeDFIterator<spvtools::opt::Loop>_> *__range2;
  unordered_map<spvtools::opt::Loop_*,_spvtools::opt::Loop_*,_std::hash<spvtools::opt::Loop_*>,_std::equal_to<spvtools::opt::Loop_*>,_std::allocator<std::pair<spvtools::opt::Loop_*const,_spvtools::opt::Loop_*>_>_>
  loop_mapping;
  LoopCloningResult *cloning_result_local;
  Loop *new_loop_local;
  LoopUtils *this_local;
  
  loop_mapping._M_h._M_single_bucket = (__node_base_ptr)cloning_result;
  std::
  unordered_map<spvtools::opt::Loop_*,_spvtools::opt::Loop_*,_std::hash<spvtools::opt::Loop_*>,_std::equal_to<spvtools::opt::Loop_*>,_std::allocator<std::pair<spvtools::opt::Loop_*const,_spvtools::opt::Loop_*>_>_>
  ::unordered_map((unordered_map<spvtools::opt::Loop_*,_spvtools::opt::Loop_*,_std::hash<spvtools::opt::Loop_*>,_std::equal_to<spvtools::opt::Loop_*>,_std::allocator<std::pair<spvtools::opt::Loop_*const,_spvtools::opt::Loop_*>_>_>
                   *)&__range2);
  ppLVar2 = std::
            unordered_map<spvtools::opt::Loop_*,_spvtools::opt::Loop_*,_std::hash<spvtools::opt::Loop_*>,_std::equal_to<spvtools::opt::Loop_*>,_std::allocator<std::pair<spvtools::opt::Loop_*const,_spvtools::opt::Loop_*>_>_>
            ::operator[]((unordered_map<spvtools::opt::Loop_*,_spvtools::opt::Loop_*,_std::hash<spvtools::opt::Loop_*>,_std::equal_to<spvtools::opt::Loop_*>,_std::allocator<std::pair<spvtools::opt::Loop_*const,_spvtools::opt::Loop_*>_>_>
                          *)&__range2,&this->loop_);
  *ppLVar2 = new_loop;
  bVar1 = Loop::HasParent(this->loop_);
  if (bVar1) {
    pLVar3 = Loop::GetParent(this->loop_);
    Loop::AddNestedLoop(pLVar3,new_loop);
  }
  end = (TreeDFIterator<spvtools::opt::Loop> *)loop_mapping._M_h._M_single_bucket;
  PopulateLoopDesc(this,new_loop,this->loop_,(LoopCloningResult *)loop_mapping._M_h._M_single_bucket
                  );
  TreeDFIterator<spvtools::opt::Loop>::TreeDFIterator(&local_168,this->loop_);
  this_01 = TreeDFIterator<spvtools::opt::Loop>::operator++(&local_168);
  TreeDFIterator<spvtools::opt::Loop>::TreeDFIterator
            ((TreeDFIterator<spvtools::opt::Loop> *)
             ((long)&__begin2.parent_iterators_.c.
                     super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish + 0x18));
  make_range<spvtools::opt::TreeDFIterator<spvtools::opt::Loop>>
            (&local_110,(opt *)this_01,
             (TreeDFIterator<spvtools::opt::Loop> *)
             ((long)&__begin2.parent_iterators_.c.
                     super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish + 0x18),end);
  TreeDFIterator<spvtools::opt::Loop>::~TreeDFIterator
            ((TreeDFIterator<spvtools::opt::Loop> *)
             ((long)&__begin2.parent_iterators_.c.
                     super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish + 0x18));
  TreeDFIterator<spvtools::opt::Loop>::~TreeDFIterator(&local_168);
  local_60 = &local_110;
  IteratorRange<spvtools::opt::TreeDFIterator<spvtools::opt::Loop>_>::begin
            ((TreeDFIterator<spvtools::opt::Loop> *)
             ((long)&__end2.parent_iterators_.c.
                     super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish + 0x18),local_60);
  IteratorRange<spvtools::opt::TreeDFIterator<spvtools::opt::Loop>_>::end
            ((TreeDFIterator<spvtools::opt::Loop> *)&sub_loop,local_60);
  while (bVar1 = TreeDFIterator<spvtools::opt::Loop>::operator!=
                           ((TreeDFIterator<spvtools::opt::Loop> *)
                            ((long)&__end2.parent_iterators_.c.
                                    super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                                    ._M_impl.super__Deque_impl_data._M_finish + 0x18),
                            (TreeDFIterator<spvtools::opt::Loop> *)&sub_loop), bVar1) {
    cloned = TreeDFIterator<spvtools::opt::Loop>::operator*
                       ((TreeDFIterator<spvtools::opt::Loop> *)
                        ((long)&__end2.parent_iterators_.c.
                                super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                                ._M_impl.super__Deque_impl_data._M_finish + 0x18));
    pLVar3 = (Loop *)::operator_new(0x90);
    Loop::Loop(pLVar3,this->context_);
    parent = pLVar3;
    local_290 = Loop::GetParent(cloned);
    ppLVar2 = std::
              unordered_map<spvtools::opt::Loop_*,_spvtools::opt::Loop_*,_std::hash<spvtools::opt::Loop_*>,_std::equal_to<spvtools::opt::Loop_*>,_std::allocator<std::pair<spvtools::opt::Loop_*const,_spvtools::opt::Loop_*>_>_>
              ::operator[]((unordered_map<spvtools::opt::Loop_*,_spvtools::opt::Loop_*,_std::hash<spvtools::opt::Loop_*>,_std::equal_to<spvtools::opt::Loop_*>,_std::allocator<std::pair<spvtools::opt::Loop_*const,_spvtools::opt::Loop_*>_>_>
                            *)&__range2,&local_290);
    local_288 = *ppLVar2;
    if (local_288 != (Loop *)0x0) {
      Loop::AddNestedLoop(local_288,parent);
    }
    pLVar3 = parent;
    local_298 = cloned;
    ppLVar2 = std::
              unordered_map<spvtools::opt::Loop_*,_spvtools::opt::Loop_*,_std::hash<spvtools::opt::Loop_*>,_std::equal_to<spvtools::opt::Loop_*>,_std::allocator<std::pair<spvtools::opt::Loop_*const,_spvtools::opt::Loop_*>_>_>
              ::operator[]((unordered_map<spvtools::opt::Loop_*,_spvtools::opt::Loop_*,_std::hash<spvtools::opt::Loop_*>,_std::equal_to<spvtools::opt::Loop_*>,_std::allocator<std::pair<spvtools::opt::Loop_*const,_spvtools::opt::Loop_*>_>_>
                            *)&__range2,&local_298);
    *ppLVar2 = pLVar3;
    PopulateLoopDesc(this,parent,cloned,(LoopCloningResult *)loop_mapping._M_h._M_single_bucket);
    TreeDFIterator<spvtools::opt::Loop>::operator++
              ((TreeDFIterator<spvtools::opt::Loop> *)
               ((long)&__end2.parent_iterators_.c.
                       super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish + 0x18));
  }
  TreeDFIterator<spvtools::opt::Loop>::~TreeDFIterator
            ((TreeDFIterator<spvtools::opt::Loop> *)&sub_loop);
  TreeDFIterator<spvtools::opt::Loop>::~TreeDFIterator
            ((TreeDFIterator<spvtools::opt::Loop> *)
             ((long)&__end2.parent_iterators_.c.
                     super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish + 0x18));
  IteratorRange<spvtools::opt::TreeDFIterator<spvtools::opt::Loop>_>::~IteratorRange(&local_110);
  this_00 = this->loop_desc_;
  std::unique_ptr<spvtools::opt::Loop,std::default_delete<spvtools::opt::Loop>>::
  unique_ptr<std::default_delete<spvtools::opt::Loop>,void>
            ((unique_ptr<spvtools::opt::Loop,std::default_delete<spvtools::opt::Loop>> *)&local_2a0,
             new_loop);
  LoopDescriptor::AddLoopNest(this_00,&local_2a0);
  std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>::~unique_ptr
            (&local_2a0);
  std::
  unordered_map<spvtools::opt::Loop_*,_spvtools::opt::Loop_*,_std::hash<spvtools::opt::Loop_*>,_std::equal_to<spvtools::opt::Loop_*>,_std::allocator<std::pair<spvtools::opt::Loop_*const,_spvtools::opt::Loop_*>_>_>
  ::~unordered_map((unordered_map<spvtools::opt::Loop_*,_spvtools::opt::Loop_*,_std::hash<spvtools::opt::Loop_*>,_std::equal_to<spvtools::opt::Loop_*>,_std::allocator<std::pair<spvtools::opt::Loop_*const,_spvtools::opt::Loop_*>_>_>
                    *)&__range2);
  return;
}

Assistant:

void LoopUtils::PopulateLoopNest(
    Loop* new_loop, const LoopCloningResult& cloning_result) const {
  std::unordered_map<Loop*, Loop*> loop_mapping;
  loop_mapping[loop_] = new_loop;

  if (loop_->HasParent()) loop_->GetParent()->AddNestedLoop(new_loop);
  PopulateLoopDesc(new_loop, loop_, cloning_result);

  for (Loop& sub_loop :
       make_range(++TreeDFIterator<Loop>(loop_), TreeDFIterator<Loop>())) {
    Loop* cloned = new Loop(context_);
    if (Loop* parent = loop_mapping[sub_loop.GetParent()])
      parent->AddNestedLoop(cloned);
    loop_mapping[&sub_loop] = cloned;
    PopulateLoopDesc(cloned, &sub_loop, cloning_result);
  }

  loop_desc_->AddLoopNest(std::unique_ptr<Loop>(new_loop));
}